

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O1

PKCS7 * d2i_PKCS7(PKCS7 **a,uchar **in,long len)

{
  PKCS7 *pPVar1;
  CBS cbs;
  CBS local_28;
  
  local_28.data = *in;
  local_28.len = len;
  pPVar1 = (PKCS7 *)pkcs7_new(&local_28);
  if (pPVar1 == (PKCS7 *)0x0) {
    pPVar1 = (PKCS7 *)0x0;
  }
  else {
    *in = local_28.data;
    if (a != (PKCS7 **)0x0) {
      PKCS7_free(*a);
      *a = pPVar1;
    }
  }
  return pPVar1;
}

Assistant:

PKCS7 *d2i_PKCS7(PKCS7 **out, const uint8_t **inp, size_t len) {
  CBS cbs;
  CBS_init(&cbs, *inp, len);
  PKCS7 *ret = pkcs7_new(&cbs);
  if (ret == NULL) {
    return NULL;
  }
  *inp = CBS_data(&cbs);
  if (out != NULL) {
    PKCS7_free(*out);
    *out = ret;
  }
  return ret;
}